

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O3

logical pnga_update55_ghosts(Integer g_a)

{
  long lVar1;
  short sVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  char **ppcVar7;
  char *pcVar8;
  char *pcVar9;
  C_Integer *pCVar10;
  int *piVar11;
  double dVar12;
  global_array_t *pgVar13;
  int _d;
  int iVar14;
  Integer proc;
  logical lVar15;
  Integer *map;
  Integer *proclist;
  size_t sVar16;
  Integer IVar17;
  Integer IVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  C_Integer CVar26;
  int i;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  int _ndim_4;
  ulong uVar32;
  long ndim;
  int iVar33;
  Integer _last;
  long lVar34;
  logical lVar35;
  Integer IVar36;
  int _ndim_6;
  int _ndim;
  int _index [7];
  Integer _hi [7];
  int count [7];
  int stride_rem [7];
  int stride_loc [7];
  Integer np;
  Integer plo_rem [7];
  char err_string [256];
  Integer plo_loc [7];
  Integer phi_rem [7];
  Integer thi_rem [7];
  Integer tlo_rem [7];
  Integer ld_rem [7];
  Integer ld_loc [7];
  Integer shi_rem [7];
  Integer slo_rem [7];
  Integer width [7];
  Integer hi_loc [7];
  Integer lo_loc [7];
  Integer increment [7];
  Integer dims [7];
  
  proc = pnga_nodeid();
  lVar15 = pnga_has_ghosts(g_a);
  lVar35 = 1;
  if (lVar15 != 0) {
    lVar1 = g_a + 1000;
    iVar4 = GA[lVar1].elemsize;
    sVar2 = GA[lVar1].ndim;
    ndim = (long)sVar2;
    iVar5 = GA[lVar1].p_handle;
    if (0 < ndim) {
      lVar20 = 0;
      do {
        increment[lVar20] = 0;
        width[lVar20] = GA[g_a + 1000].width[lVar20];
        dims[lVar20] = GA[g_a + 1000].dims[lVar20];
        if ((lo_loc[lVar20] == 0) && (hi_loc[lVar20] == -1)) goto LAB_00186b2f;
        lVar20 = lVar20 + 1;
      } while (ndim != lVar20);
    }
    lVar15 = gai_check_ghost_distr(g_a);
    IVar36 = GAnproc;
    if (lVar15 == 0) {
LAB_00186b2f:
      lVar35 = 0;
    }
    else {
      map = (Integer *)malloc(GAnproc * 0x70 | 8);
      if (map == (Integer *)0x0) {
        pnga_error("pnga_update55_ghosts:malloc failed (_ga_map)",0);
        IVar36 = GAnproc;
      }
      proclist = (Integer *)malloc(IVar36 << 3);
      if (proclist == (Integer *)0x0) {
        pnga_error("pnga_update55_ghosts:malloc failed (_ga_proclist)",0);
      }
      pnga_distribution(g_a,proc,lo_loc,hi_loc);
      *GA_Update_Signal = 1;
      if (0 < sVar2) {
        lVar20 = ndim + -1;
        lVar21 = 1;
        if (1 < lVar20) {
          lVar21 = lVar20;
        }
        IVar36 = 0;
        iVar33 = 0;
        do {
          lVar6 = width[IVar36];
          if (lVar6 != 0) {
            get_remote_block_neg(IVar36,ndim,lo_loc,hi_loc,slo_rem,shi_rem,dims,width);
            lVar15 = pnga_locate_region(g_a,slo_rem,shi_rem,map,proclist,&np);
            if (lVar15 == 0) {
              builtin_strncpy(err_string,"cannot locate region: ",0x17);
              strcpy(err_string + 0x16,GA[lVar1].name);
              sVar16 = strlen(err_string);
              sprintf(err_string + (int)sVar16," [%ld:%ld ",slo_rem[0],shi_rem[0]);
              sVar16 = strlen(err_string);
              iVar19 = (int)sVar16;
              IVar17 = pnga_ndim(g_a);
              if (1 < IVar17) {
                lVar34 = 1;
                do {
                  sprintf(err_string + (int)sVar16,",%ld:%ld ",slo_rem[lVar34],shi_rem[lVar34]);
                  sVar16 = strlen(err_string);
                  iVar19 = (int)sVar16;
                  lVar34 = lVar34 + 1;
                  IVar17 = pnga_ndim(g_a);
                } while (lVar34 < IVar17);
              }
              (err_string + iVar19)[0] = ']';
              (err_string + iVar19)[1] = '\0';
              pnga_error(err_string,g_a);
            }
            IVar17 = *proclist;
            pnga_distribution(g_a,IVar17,tlo_rem,thi_rem);
            pgVar13 = GA;
            lVar34 = 0;
            do {
              if (increment[lVar34] == 0) {
                if (IVar36 == lVar34) {
                  plo_rem[IVar36] = lVar6 + 1 + (thi_rem[IVar36] - tlo_rem[IVar36]);
                  phi_rem[IVar36] = (thi_rem[IVar36] - tlo_rem[IVar36]) + lVar6 * 2;
                  plo_loc[IVar36] = lVar6;
                }
                else {
                  lVar23 = width[lVar34];
                  plo_rem[lVar34] = lVar23;
                  phi_rem[lVar34] = (thi_rem[lVar34] + lVar23) - tlo_rem[lVar34];
                  plo_loc[lVar34] = lVar23;
                }
              }
              else {
                plo_rem[lVar34] = 0;
                phi_rem[lVar34] = (increment[lVar34] + thi_rem[lVar34]) - tlo_rem[lVar34];
                plo_loc[lVar34] = 0;
              }
              lVar34 = lVar34 + 1;
            } while (ndim != lVar34);
            uVar3 = GA[lVar1].ndim;
            uVar32 = (ulong)(short)uVar3;
            iVar19 = GA[lVar1].distr_type;
            if (iVar19 - 1U < 3) {
              lVar34 = GA[lVar1].num_blocks[0];
              lVar23 = (long)(int)proc % lVar34;
              _index[0] = (int)lVar23;
              if (1 < (short)uVar3) {
                lVar29 = 0;
                IVar18 = proc;
                do {
                  IVar18 = (long)((int)IVar18 - (int)lVar23) / lVar34;
                  lVar34 = GA[g_a + 1000].num_blocks[lVar29 + 1];
                  lVar23 = (long)(int)IVar18 % lVar34;
                  _index[lVar29 + 1] = (int)lVar23;
                  lVar29 = lVar29 + 1;
                } while ((uVar32 & 0xffffffff) - 1 != lVar29);
              }
              if (0 < (short)uVar3) {
                lVar34 = 0;
                do {
                  iVar22 = *(int *)((long)_index + lVar34);
                  lVar23 = *(long *)((long)GA[g_a + 1000].block_dims + lVar34 * 2);
                  *(long *)(err_string + lVar34 * 2) = lVar23 * iVar22 + 1;
                  lVar23 = ((long)iVar22 + 1) * lVar23;
                  lVar29 = *(long *)((long)GA[g_a + 1000].dims + lVar34 * 2);
                  if (lVar29 <= lVar23) {
                    lVar23 = lVar29;
                  }
                  *(long *)((long)_hi + lVar34 * 2) = lVar23;
                  lVar34 = lVar34 + 4;
                } while ((uVar32 & 0xffffffff) << 2 != lVar34);
              }
            }
            else if (iVar19 == 4) {
              lVar34 = GA[lVar1].num_blocks[0];
              lVar23 = (long)(int)proc % lVar34;
              _index[0] = (int)lVar23;
              if (1 < (short)uVar3) {
                lVar29 = 0;
                IVar18 = proc;
                do {
                  IVar18 = (long)((int)IVar18 - (int)lVar23) / lVar34;
                  lVar34 = GA[g_a + 1000].num_blocks[lVar29 + 1];
                  lVar23 = (long)(int)IVar18 % lVar34;
                  _index[lVar29 + 1] = (int)lVar23;
                  lVar29 = lVar29 + 1;
                } while ((uVar32 & 0xffffffff) - 1 != lVar29);
              }
              if (0 < (short)uVar3) {
                pCVar10 = GA[lVar1].mapc;
                lVar34 = 0;
                iVar22 = 0;
                do {
                  iVar14 = *(int *)((long)_index + lVar34);
                  lVar29 = (long)iVar22 + (long)iVar14;
                  *(C_Integer *)(err_string + lVar34 * 2) = pCVar10[lVar29];
                  lVar23 = *(long *)((long)GA[lVar1].num_blocks + lVar34 * 2);
                  if ((long)iVar14 < lVar23 + -1) {
                    lVar29 = pCVar10[lVar29 + 1] + -1;
                  }
                  else {
                    lVar29 = *(long *)((long)GA[lVar1].dims + lVar34 * 2);
                  }
                  *(long *)((long)_hi + lVar34 * 2) = lVar29;
                  iVar22 = iVar22 + (int)lVar23;
                  lVar34 = lVar34 + 4;
                } while ((uVar32 & 0xffffffff) << 2 != lVar34);
              }
            }
            else if (iVar19 == 0) {
              if (GA[lVar1].num_rstrctd == 0) {
                if (0 < (short)uVar3) {
                  lVar34 = 1;
                  uVar25 = 0;
                  do {
                    lVar34 = lVar34 * GA[g_a + 1000].nblock[uVar25];
                    uVar25 = uVar25 + 1;
                  } while (uVar32 != uVar25);
                  if ((proc < 0) || (lVar34 <= proc)) goto LAB_00185875;
                  if (0 < (short)uVar3) {
                    pCVar10 = GA[lVar1].mapc;
                    uVar25 = 0;
                    lVar34 = 0;
                    IVar18 = proc;
                    do {
                      lVar29 = (long)GA[g_a + 1000].nblock[uVar25];
                      lVar23 = IVar18 % lVar29;
                      plo_loc[uVar25 - 0x20] = pCVar10[lVar23 + lVar34];
                      if (lVar23 == lVar29 + -1) {
                        CVar26 = GA[g_a + 1000].dims[uVar25];
                      }
                      else {
                        CVar26 = pCVar10[lVar23 + lVar34 + 1] + -1;
                      }
                      lVar34 = lVar34 + lVar29;
                      _hi[uVar25] = CVar26;
                      uVar25 = uVar25 + 1;
                      IVar18 = IVar18 / lVar29;
                    } while (uVar32 != uVar25);
                  }
                }
              }
              else if (proc < GA[lVar1].num_rstrctd) {
                if (0 < (short)uVar3) {
                  lVar34 = 1;
                  uVar25 = 0;
                  do {
                    lVar34 = lVar34 * GA[g_a + 1000].nblock[uVar25];
                    uVar25 = uVar25 + 1;
                  } while (uVar32 != uVar25);
                  if ((proc < 0) || (lVar34 <= proc)) goto LAB_00185875;
                  if (0 < (short)uVar3) {
                    pCVar10 = GA[lVar1].mapc;
                    uVar25 = 0;
                    lVar34 = 0;
                    IVar18 = proc;
                    do {
                      lVar29 = (long)GA[g_a + 1000].nblock[uVar25];
                      lVar23 = IVar18 % lVar29;
                      plo_loc[uVar25 - 0x20] = pCVar10[lVar23 + lVar34];
                      if (lVar23 == lVar29 + -1) {
                        CVar26 = GA[g_a + 1000].dims[uVar25];
                      }
                      else {
                        CVar26 = pCVar10[lVar23 + lVar34 + 1] + -1;
                      }
                      lVar34 = lVar34 + lVar29;
                      _hi[uVar25] = CVar26;
                      uVar25 = uVar25 + 1;
                      IVar18 = IVar18 / lVar29;
                    } while (uVar32 != uVar25);
                  }
                }
              }
              else {
LAB_00185875:
                if (0 < (short)uVar3) {
                  memset(err_string,0,uVar32 * 8);
                  memset(_hi,0xff,uVar32 * 8);
                }
              }
            }
            if (uVar32 == 1) {
              ld_loc[0] = (_hi[0] - err_string._0_8_) + pgVar13[lVar1].width[0] * 2 + 1;
            }
            if ((short)uVar3 < 2) {
              lVar23 = 1;
              lVar34 = 0;
            }
            else {
              lVar23 = 1;
              lVar29 = 0;
              lVar34 = 0;
              do {
                lVar34 = lVar34 + plo_loc[lVar29] * lVar23;
                lVar27 = (_hi[lVar29] - plo_loc[lVar29 + -0x20]) +
                         pgVar13[g_a + 1000].width[lVar29] * 2 + 1;
                ld_loc[lVar29] = lVar27;
                lVar23 = lVar23 * lVar27;
                lVar29 = lVar29 + 1;
              } while (uVar32 - 1 != lVar29);
            }
            lVar29 = plo_loc[uVar32 - 1];
            ppcVar7 = pgVar13[lVar1].ptr;
            iVar22 = pgVar13[lVar1].elemsize;
            pcVar8 = ppcVar7[proc];
            _ndim_6 = (int)IVar17;
            if (iVar19 - 1U < 3) {
              lVar27 = pgVar13[lVar1].num_blocks[0];
              lVar24 = (long)_ndim_6 % lVar27;
              _index[0] = (int)lVar24;
              if (1 < (short)uVar3) {
                lVar30 = 0;
                IVar18 = IVar17;
                do {
                  IVar18 = (long)((int)IVar18 - (int)lVar24) / lVar27;
                  lVar27 = pgVar13[g_a + 1000].num_blocks[lVar30 + 1];
                  lVar24 = (long)(int)IVar18 % lVar27;
                  _index[lVar30 + 1] = (int)lVar24;
                  lVar30 = lVar30 + 1;
                } while ((uVar32 & 0xffffffff) - 1 != lVar30);
              }
              if (0 < (short)uVar3) {
                lVar27 = 0;
                do {
                  iVar19 = *(int *)((long)_index + lVar27);
                  lVar24 = *(long *)((long)pgVar13[g_a + 1000].block_dims + lVar27 * 2);
                  *(long *)(err_string + lVar27 * 2) = lVar24 * iVar19 + 1;
                  lVar24 = ((long)iVar19 + 1) * lVar24;
                  lVar30 = *(long *)((long)pgVar13[g_a + 1000].dims + lVar27 * 2);
                  if (lVar30 <= lVar24) {
                    lVar24 = lVar30;
                  }
                  *(long *)((long)_hi + lVar27 * 2) = lVar24;
                  lVar27 = lVar27 + 4;
                } while ((uVar32 & 0xffffffff) << 2 != lVar27);
              }
            }
            else if (iVar19 == 4) {
              lVar27 = pgVar13[lVar1].num_blocks[0];
              lVar24 = (long)_ndim_6 % lVar27;
              _index[0] = (int)lVar24;
              if (1 < (short)uVar3) {
                lVar30 = 0;
                IVar18 = IVar17;
                do {
                  IVar18 = (long)((int)IVar18 - (int)lVar24) / lVar27;
                  lVar27 = pgVar13[g_a + 1000].num_blocks[lVar30 + 1];
                  lVar24 = (long)(int)IVar18 % lVar27;
                  _index[lVar30 + 1] = (int)lVar24;
                  lVar30 = lVar30 + 1;
                } while ((uVar32 & 0xffffffff) - 1 != lVar30);
              }
              if (0 < (short)uVar3) {
                pCVar10 = pgVar13[lVar1].mapc;
                lVar27 = 0;
                iVar19 = 0;
                do {
                  iVar14 = *(int *)((long)_index + lVar27);
                  lVar30 = (long)iVar19 + (long)iVar14;
                  *(C_Integer *)(err_string + lVar27 * 2) = pCVar10[lVar30];
                  lVar24 = *(long *)((long)pgVar13[lVar1].num_blocks + lVar27 * 2);
                  if ((long)iVar14 < lVar24 + -1) {
                    lVar30 = pCVar10[lVar30 + 1] + -1;
                  }
                  else {
                    lVar30 = *(long *)((long)pgVar13[lVar1].dims + lVar27 * 2);
                  }
                  *(long *)((long)_hi + lVar27 * 2) = lVar30;
                  iVar19 = iVar19 + (int)lVar24;
                  lVar27 = lVar27 + 4;
                } while ((uVar32 & 0xffffffff) << 2 != lVar27);
              }
            }
            else if (iVar19 == 0) {
              if (pgVar13[lVar1].num_rstrctd == 0) {
                if (0 < (short)uVar3) {
                  lVar27 = 1;
                  uVar25 = 0;
                  do {
                    lVar27 = lVar27 * pgVar13[g_a + 1000].nblock[uVar25];
                    uVar25 = uVar25 + 1;
                  } while (uVar32 != uVar25);
                  if ((IVar17 < 0) || (lVar27 <= IVar17)) {
LAB_00185ca6:
                    uVar25 = uVar32;
                    if (0 < (short)uVar3) goto LAB_00185cb3;
                  }
                  else if (0 < (short)uVar3) {
                    pCVar10 = pgVar13[lVar1].mapc;
                    lVar27 = 0;
                    uVar25 = 0;
                    IVar18 = IVar17;
                    do {
                      lVar30 = (long)pgVar13[g_a + 1000].nblock[uVar25];
                      lVar24 = IVar18 % lVar30;
                      plo_loc[uVar25 - 0x20] = pCVar10[lVar24 + lVar27];
                      if (lVar24 == lVar30 + -1) {
                        CVar26 = pgVar13[g_a + 1000].dims[uVar25];
                      }
                      else {
                        CVar26 = pCVar10[lVar24 + lVar27 + 1] + -1;
                      }
                      lVar27 = lVar27 + lVar30;
                      _hi[uVar25] = CVar26;
                      uVar25 = uVar25 + 1;
                      IVar18 = IVar18 / lVar30;
                    } while (uVar32 != uVar25);
                  }
                }
              }
              else if (IVar17 < pgVar13[lVar1].num_rstrctd) {
                if (0 < (short)uVar3) {
                  lVar27 = 1;
                  uVar25 = 0;
                  do {
                    lVar27 = lVar27 * pgVar13[g_a + 1000].nblock[uVar25];
                    uVar25 = uVar25 + 1;
                  } while (uVar32 != uVar25);
                  if ((IVar17 < 0) || (lVar27 <= IVar17)) goto LAB_00185ca6;
                  if (0 < (short)uVar3) {
                    pCVar10 = pgVar13[lVar1].mapc;
                    lVar27 = 0;
                    uVar25 = 0;
                    IVar18 = IVar17;
                    do {
                      lVar30 = (long)pgVar13[g_a + 1000].nblock[uVar25];
                      lVar24 = IVar18 % lVar30;
                      plo_loc[uVar25 - 0x20] = pCVar10[lVar24 + lVar27];
                      if (lVar24 == lVar30 + -1) {
                        CVar26 = pgVar13[g_a + 1000].dims[uVar25];
                      }
                      else {
                        CVar26 = pCVar10[lVar24 + lVar27 + 1] + -1;
                      }
                      lVar27 = lVar27 + lVar30;
                      _hi[uVar25] = CVar26;
                      uVar25 = uVar25 + 1;
                      IVar18 = IVar18 / lVar30;
                    } while (uVar32 != uVar25);
                  }
                }
              }
              else if (0 < (short)uVar3) {
                uVar25 = (ulong)uVar3;
LAB_00185cb3:
                memset(err_string,0,uVar25 << 3);
                memset(_hi,0xff,uVar25 << 3);
              }
            }
            if (uVar32 == 1) {
              ld_rem[0] = (_hi[0] - err_string._0_8_) + pgVar13[lVar1].width[0] * 2 + 1;
            }
            if ((short)uVar3 < 2) {
              lVar24 = 1;
              lVar27 = 0;
            }
            else {
              lVar24 = 1;
              lVar30 = 0;
              lVar27 = 0;
              do {
                lVar27 = lVar27 + plo_rem[lVar30] * lVar24;
                lVar28 = (_hi[lVar30] - plo_loc[lVar30 + -0x20]) +
                         pgVar13[g_a + 1000].width[lVar30] * 2 + 1;
                ld_rem[lVar30] = lVar28;
                lVar24 = lVar24 * lVar28;
                lVar30 = lVar30 + 1;
              } while (uVar32 - 1 != lVar30);
            }
            lVar30 = plo_rem[uVar32 - 1];
            pcVar9 = ppcVar7[IVar17];
            stride_loc[0] = iVar4;
            stride_rem[0] = iVar4;
            if (sVar2 != 1) {
              lVar28 = 0;
              iVar19 = iVar4;
              iVar14 = iVar4;
              do {
                iVar19 = iVar19 * (int)ld_rem[lVar28];
                stride_rem[lVar28] = iVar19;
                iVar14 = iVar14 * (int)ld_loc[lVar28];
                stride_loc[lVar28] = iVar14;
                stride_rem[lVar28 + 1] = iVar19;
                stride_loc[lVar28 + 1] = iVar14;
                lVar28 = lVar28 + 1;
              } while (lVar21 != lVar28);
            }
            lVar28 = 0;
            do {
              count[lVar28] = ((int)phi_rem[lVar28] - (int)plo_rem[lVar28]) + 1;
              lVar28 = lVar28 + 1;
            } while (ndim != lVar28);
            count[0] = count[0] * iVar4;
            if (-1 < iVar5) {
              IVar17 = (Integer)PGRP_LIST[iVar5].inv_map_proc_list[IVar17];
            }
            ARMCI_PutS_flag(pcVar8 + (lVar23 * lVar29 + lVar34) * (long)iVar22,stride_loc,
                            pcVar9 + (lVar24 * lVar30 + lVar27) * (long)iVar22,stride_rem,count,
                            (int)lVar20,GA_Update_Flags[IVar17] + iVar33,*GA_Update_Signal,
                            (int)IVar17);
            get_remote_block_pos(IVar36,ndim,lo_loc,hi_loc,slo_rem,shi_rem,dims,width);
            lVar15 = pnga_locate_region(g_a,slo_rem,shi_rem,map,proclist,&np);
            if (lVar15 == 0) {
              builtin_strncpy(err_string,"cannot locate region: ",0x17);
              strcpy(err_string + 0x16,GA[lVar1].name);
              sVar16 = strlen(err_string);
              sprintf(err_string + (int)sVar16," [%ld:%ld ",slo_rem[0],shi_rem[0]);
              sVar16 = strlen(err_string);
              iVar19 = (int)sVar16;
              IVar17 = pnga_ndim(g_a);
              if (1 < IVar17) {
                lVar34 = 1;
                do {
                  sprintf(err_string + (int)sVar16,",%ld:%ld ",slo_rem[lVar34],shi_rem[lVar34]);
                  sVar16 = strlen(err_string);
                  iVar19 = (int)sVar16;
                  lVar34 = lVar34 + 1;
                  IVar17 = pnga_ndim(g_a);
                } while (lVar34 < IVar17);
              }
              (err_string + iVar19)[0] = ']';
              (err_string + iVar19)[1] = '\0';
              pnga_error(err_string,g_a);
            }
            lVar34 = *proclist;
            pnga_distribution(g_a,lVar34,tlo_rem,thi_rem);
            pgVar13 = GA;
            lVar23 = 0;
            do {
              if (increment[lVar23] == 0) {
                if (IVar36 == lVar23) {
                  plo_rem[IVar36] = 0;
                  phi_rem[IVar36] = lVar6 + -1;
                  plo_loc[IVar36] = (hi_loc[IVar36] + lVar6 + -1) - lo_loc[IVar36];
                }
                else {
                  lVar29 = width[lVar23];
                  plo_rem[lVar23] = lVar29;
                  phi_rem[lVar23] = (thi_rem[lVar23] + lVar29) - tlo_rem[lVar23];
                  plo_loc[lVar23] = lVar29;
                }
              }
              else {
                plo_rem[lVar23] = 0;
                phi_rem[lVar23] = (increment[lVar23] + thi_rem[lVar23]) - tlo_rem[lVar23];
                plo_loc[lVar23] = 0;
              }
              lVar23 = lVar23 + 1;
            } while (ndim != lVar23);
            uVar3 = GA[lVar1].ndim;
            uVar32 = (ulong)(short)uVar3;
            iVar19 = GA[lVar1].distr_type;
            if (iVar19 - 1U < 3) {
              lVar23 = GA[lVar1].num_blocks[0];
              lVar29 = (long)(int)GAme % lVar23;
              _index[0] = (int)lVar29;
              if (1 < (short)uVar3) {
                lVar27 = 0;
                IVar17 = GAme;
                do {
                  IVar17 = (long)((int)IVar17 - (int)lVar29) / lVar23;
                  lVar23 = GA[g_a + 1000].num_blocks[lVar27 + 1];
                  lVar29 = (long)(int)IVar17 % lVar23;
                  _index[lVar27 + 1] = (int)lVar29;
                  lVar27 = lVar27 + 1;
                } while ((uVar32 & 0xffffffff) - 1 != lVar27);
              }
              if (0 < (short)uVar3) {
                lVar23 = 0;
                do {
                  iVar22 = *(int *)((long)_index + lVar23);
                  lVar29 = *(long *)((long)GA[g_a + 1000].block_dims + lVar23 * 2);
                  *(long *)(err_string + lVar23 * 2) = lVar29 * iVar22 + 1;
                  lVar29 = ((long)iVar22 + 1) * lVar29;
                  lVar27 = *(long *)((long)GA[g_a + 1000].dims + lVar23 * 2);
                  if (lVar27 <= lVar29) {
                    lVar29 = lVar27;
                  }
                  *(long *)((long)_hi + lVar23 * 2) = lVar29;
                  lVar23 = lVar23 + 4;
                } while ((uVar32 & 0xffffffff) << 2 != lVar23);
              }
            }
            else if (iVar19 == 4) {
              lVar23 = GA[lVar1].num_blocks[0];
              lVar29 = (long)(int)GAme % lVar23;
              _index[0] = (int)lVar29;
              if (1 < (short)uVar3) {
                lVar27 = 0;
                IVar17 = GAme;
                do {
                  IVar17 = (long)((int)IVar17 - (int)lVar29) / lVar23;
                  lVar23 = GA[g_a + 1000].num_blocks[lVar27 + 1];
                  lVar29 = (long)(int)IVar17 % lVar23;
                  _index[lVar27 + 1] = (int)lVar29;
                  lVar27 = lVar27 + 1;
                } while ((uVar32 & 0xffffffff) - 1 != lVar27);
              }
              if (0 < (short)uVar3) {
                pCVar10 = GA[lVar1].mapc;
                lVar23 = 0;
                iVar22 = 0;
                do {
                  iVar14 = *(int *)((long)_index + lVar23);
                  lVar27 = (long)iVar22 + (long)iVar14;
                  *(C_Integer *)(err_string + lVar23 * 2) = pCVar10[lVar27];
                  lVar29 = *(long *)((long)GA[lVar1].num_blocks + lVar23 * 2);
                  if ((long)iVar14 < lVar29 + -1) {
                    lVar27 = pCVar10[lVar27 + 1] + -1;
                  }
                  else {
                    lVar27 = *(long *)((long)GA[lVar1].dims + lVar23 * 2);
                  }
                  *(long *)((long)_hi + lVar23 * 2) = lVar27;
                  iVar22 = iVar22 + (int)lVar29;
                  lVar23 = lVar23 + 4;
                } while ((uVar32 & 0xffffffff) << 2 != lVar23);
              }
            }
            else if (iVar19 == 0) {
              if (GA[lVar1].num_rstrctd == 0) {
                if (0 < (short)uVar3) {
                  lVar23 = 1;
                  uVar25 = 0;
                  do {
                    lVar23 = lVar23 * GA[g_a + 1000].nblock[uVar25];
                    uVar25 = uVar25 + 1;
                  } while (uVar32 != uVar25);
                  if (GAme < 0 || lVar23 <= GAme) goto LAB_0018642b;
                  if (0 < (short)uVar3) {
                    pCVar10 = GA[lVar1].mapc;
                    lVar23 = 0;
                    uVar25 = 0;
                    IVar17 = GAme;
                    do {
                      lVar27 = (long)GA[g_a + 1000].nblock[uVar25];
                      lVar29 = IVar17 % lVar27;
                      plo_loc[uVar25 - 0x20] = pCVar10[lVar29 + lVar23];
                      if (lVar29 == lVar27 + -1) {
                        CVar26 = GA[g_a + 1000].dims[uVar25];
                      }
                      else {
                        CVar26 = pCVar10[lVar29 + lVar23 + 1] + -1;
                      }
                      lVar23 = lVar23 + lVar27;
                      _hi[uVar25] = CVar26;
                      uVar25 = uVar25 + 1;
                      IVar17 = IVar17 / lVar27;
                    } while (uVar32 != uVar25);
                  }
                }
              }
              else if (GAme < GA[lVar1].num_rstrctd) {
                if (0 < (short)uVar3) {
                  lVar23 = 1;
                  uVar25 = 0;
                  do {
                    lVar23 = lVar23 * GA[g_a + 1000].nblock[uVar25];
                    uVar25 = uVar25 + 1;
                  } while (uVar32 != uVar25);
                  if ((GAme < 0) || (lVar23 <= GAme)) goto LAB_0018642b;
                  if (0 < (short)uVar3) {
                    pCVar10 = GA[lVar1].mapc;
                    lVar23 = 0;
                    uVar25 = 0;
                    IVar17 = GAme;
                    do {
                      lVar27 = (long)GA[g_a + 1000].nblock[uVar25];
                      lVar29 = IVar17 % lVar27;
                      plo_loc[uVar25 - 0x20] = pCVar10[lVar29 + lVar23];
                      if (lVar29 == lVar27 + -1) {
                        CVar26 = GA[g_a + 1000].dims[uVar25];
                      }
                      else {
                        CVar26 = pCVar10[lVar29 + lVar23 + 1] + -1;
                      }
                      lVar23 = lVar23 + lVar27;
                      _hi[uVar25] = CVar26;
                      uVar25 = uVar25 + 1;
                      IVar17 = IVar17 / lVar27;
                    } while (uVar32 != uVar25);
                  }
                }
              }
              else {
LAB_0018642b:
                if (0 < (short)uVar3) {
                  memset(err_string,0,uVar32 * 8);
                  memset(_hi,0xff,uVar32 * 8);
                }
              }
            }
            if (uVar32 == 1) {
              ld_loc[0] = (_hi[0] - err_string._0_8_) + pgVar13[lVar1].width[0] * 2 + 1;
            }
            if ((short)uVar3 < 2) {
              lVar29 = 1;
              lVar23 = 0;
            }
            else {
              lVar29 = 1;
              lVar23 = 0;
              lVar27 = 0;
              do {
                lVar23 = lVar23 + plo_loc[lVar27] * lVar29;
                lVar24 = (_hi[lVar27] - plo_loc[lVar27 + -0x20]) +
                         pgVar13[g_a + 1000].width[lVar27] * 2 + 1;
                ld_loc[lVar27] = lVar24;
                lVar29 = lVar29 * lVar24;
                lVar27 = lVar27 + 1;
              } while (uVar32 - 1 != lVar27);
            }
            lVar27 = plo_loc[uVar32 - 1];
            ppcVar7 = pgVar13[lVar1].ptr;
            iVar22 = pgVar13[lVar1].elemsize;
            pcVar8 = ppcVar7[GAme];
            if (iVar19 - 1U < 3) {
              lVar24 = pgVar13[lVar1].num_blocks[0];
              lVar30 = (long)(int)lVar34 % lVar24;
              _index[0] = (int)lVar30;
              if (1 < (short)uVar3) {
                lVar31 = 0;
                lVar28 = lVar34;
                do {
                  lVar28 = (long)((int)lVar28 - (int)lVar30) / lVar24;
                  lVar24 = pgVar13[g_a + 1000].num_blocks[lVar31 + 1];
                  lVar30 = (long)(int)lVar28 % lVar24;
                  _index[lVar31 + 1] = (int)lVar30;
                  lVar31 = lVar31 + 1;
                } while ((uVar32 & 0xffffffff) - 1 != lVar31);
              }
              if (0 < (short)uVar3) {
                lVar24 = 0;
                do {
                  iVar19 = *(int *)((long)_index + lVar24);
                  lVar30 = *(long *)((long)pgVar13[g_a + 1000].block_dims + lVar24 * 2);
                  *(long *)(err_string + lVar24 * 2) = lVar30 * iVar19 + 1;
                  lVar30 = ((long)iVar19 + 1) * lVar30;
                  lVar28 = *(long *)((long)pgVar13[g_a + 1000].dims + lVar24 * 2);
                  if (lVar28 <= lVar30) {
                    lVar30 = lVar28;
                  }
                  *(long *)((long)_hi + lVar24 * 2) = lVar30;
                  lVar24 = lVar24 + 4;
                } while ((uVar32 & 0xffffffff) << 2 != lVar24);
              }
            }
            else if (iVar19 == 4) {
              lVar24 = pgVar13[lVar1].num_blocks[0];
              lVar30 = (long)(int)lVar34 % lVar24;
              _index[0] = (int)lVar30;
              if (1 < (short)uVar3) {
                lVar31 = 0;
                lVar28 = lVar34;
                do {
                  lVar28 = (long)((int)lVar28 - (int)lVar30) / lVar24;
                  lVar24 = pgVar13[g_a + 1000].num_blocks[lVar31 + 1];
                  lVar30 = (long)(int)lVar28 % lVar24;
                  _index[lVar31 + 1] = (int)lVar30;
                  lVar31 = lVar31 + 1;
                } while ((uVar32 & 0xffffffff) - 1 != lVar31);
              }
              if (0 < (short)uVar3) {
                pCVar10 = pgVar13[lVar1].mapc;
                lVar24 = 0;
                iVar19 = 0;
                do {
                  iVar14 = *(int *)((long)_index + lVar24);
                  lVar28 = (long)iVar19 + (long)iVar14;
                  *(C_Integer *)(err_string + lVar24 * 2) = pCVar10[lVar28];
                  lVar30 = *(long *)((long)pgVar13[lVar1].num_blocks + lVar24 * 2);
                  if ((long)iVar14 < lVar30 + -1) {
                    lVar28 = pCVar10[lVar28 + 1] + -1;
                  }
                  else {
                    lVar28 = *(long *)((long)pgVar13[lVar1].dims + lVar24 * 2);
                  }
                  *(long *)((long)_hi + lVar24 * 2) = lVar28;
                  iVar19 = iVar19 + (int)lVar30;
                  lVar24 = lVar24 + 4;
                } while ((uVar32 & 0xffffffff) << 2 != lVar24);
              }
            }
            else if (iVar19 == 0) {
              if (pgVar13[lVar1].num_rstrctd == 0) {
                if (0 < (short)uVar3) {
                  lVar24 = 1;
                  uVar25 = 0;
                  do {
                    lVar24 = lVar24 * pgVar13[g_a + 1000].nblock[uVar25];
                    uVar25 = uVar25 + 1;
                  } while (uVar32 != uVar25);
                  if ((lVar34 < 0) || (lVar24 <= lVar34)) {
LAB_00186846:
                    uVar25 = uVar32;
                    if (0 < (short)uVar3) goto LAB_00186853;
                  }
                  else if (0 < (short)uVar3) {
                    pCVar10 = pgVar13[lVar1].mapc;
                    lVar30 = 0;
                    uVar25 = 0;
                    lVar24 = lVar34;
                    do {
                      lVar31 = (long)pgVar13[g_a + 1000].nblock[uVar25];
                      lVar28 = lVar24 % lVar31;
                      plo_loc[uVar25 - 0x20] = pCVar10[lVar28 + lVar30];
                      if (lVar28 == lVar31 + -1) {
                        CVar26 = pgVar13[g_a + 1000].dims[uVar25];
                      }
                      else {
                        CVar26 = pCVar10[lVar28 + lVar30 + 1] + -1;
                      }
                      lVar30 = lVar30 + lVar31;
                      _hi[uVar25] = CVar26;
                      uVar25 = uVar25 + 1;
                      lVar24 = lVar24 / lVar31;
                    } while (uVar32 != uVar25);
                  }
                }
              }
              else if (lVar34 < pgVar13[lVar1].num_rstrctd) {
                if (0 < (short)uVar3) {
                  lVar24 = 1;
                  uVar25 = 0;
                  do {
                    lVar24 = lVar24 * pgVar13[g_a + 1000].nblock[uVar25];
                    uVar25 = uVar25 + 1;
                  } while (uVar32 != uVar25);
                  if ((lVar34 < 0) || (lVar24 <= lVar34)) goto LAB_00186846;
                  if (0 < (short)uVar3) {
                    pCVar10 = pgVar13[lVar1].mapc;
                    lVar30 = 0;
                    uVar25 = 0;
                    lVar24 = lVar34;
                    do {
                      lVar31 = (long)pgVar13[g_a + 1000].nblock[uVar25];
                      lVar28 = lVar24 % lVar31;
                      plo_loc[uVar25 - 0x20] = pCVar10[lVar28 + lVar30];
                      if (lVar28 == lVar31 + -1) {
                        CVar26 = pgVar13[g_a + 1000].dims[uVar25];
                      }
                      else {
                        CVar26 = pCVar10[lVar28 + lVar30 + 1] + -1;
                      }
                      lVar30 = lVar30 + lVar31;
                      _hi[uVar25] = CVar26;
                      uVar25 = uVar25 + 1;
                      lVar24 = lVar24 / lVar31;
                    } while (uVar32 != uVar25);
                  }
                }
              }
              else if (0 < (short)uVar3) {
                uVar25 = (ulong)uVar3;
LAB_00186853:
                memset(err_string,0,uVar25 << 3);
                memset(_hi,0xff,uVar25 << 3);
              }
            }
            if (uVar32 == 1) {
              ld_rem[0] = (_hi[0] - err_string._0_8_) + pgVar13[lVar1].width[0] * 2 + 1;
            }
            if ((short)uVar3 < 2) {
              lVar30 = 1;
              lVar24 = 0;
            }
            else {
              lVar30 = 1;
              lVar24 = 0;
              lVar28 = 0;
              do {
                lVar24 = lVar24 + plo_rem[lVar28] * lVar30;
                lVar31 = (_hi[lVar28] - plo_loc[lVar28 + -0x20]) +
                         pgVar13[g_a + 1000].width[lVar28] * 2 + 1;
                ld_rem[lVar28] = lVar31;
                lVar30 = lVar30 * lVar31;
                lVar28 = lVar28 + 1;
              } while (uVar32 - 1 != lVar28);
            }
            lVar28 = plo_rem[uVar32 - 1];
            pcVar9 = ppcVar7[lVar34];
            stride_loc[0] = iVar4;
            stride_rem[0] = iVar4;
            if (sVar2 != 1) {
              lVar31 = 0;
              iVar19 = iVar4;
              iVar14 = iVar4;
              do {
                iVar19 = iVar19 * (int)ld_rem[lVar31];
                stride_rem[lVar31] = iVar19;
                iVar14 = iVar14 * (int)ld_loc[lVar31];
                stride_loc[lVar31] = iVar14;
                stride_rem[lVar31 + 1] = iVar19;
                stride_loc[lVar31 + 1] = iVar14;
                lVar31 = lVar31 + 1;
              } while (lVar21 != lVar31);
            }
            lVar31 = 0;
            do {
              count[lVar31] = ((int)phi_rem[lVar31] - (int)plo_rem[lVar31]) + 1;
              lVar31 = lVar31 + 1;
            } while (ndim != lVar31);
            count[0] = count[0] * iVar4;
            if (-1 < iVar5) {
              lVar34 = (long)PGRP_LIST[iVar5].inv_map_proc_list[lVar34];
            }
            ARMCI_PutS_flag(pcVar8 + (lVar29 * lVar27 + lVar23) * (long)iVar22,stride_loc,
                            pcVar9 + (lVar30 * lVar28 + lVar24) * (long)iVar22,stride_rem,count,
                            (int)lVar20,GA_Update_Flags[lVar34] + (long)iVar33 + 1,*GA_Update_Signal
                            ,(int)lVar34);
            iVar33 = iVar33 + 2;
          }
          piVar11 = GA_Update_Flags[GAme];
          iVar19 = 1;
          while ((piVar11[(long)iVar33 + -2] == 0 || (piVar11[(long)iVar33 + -1] == 0))) {
            dVar12 = (double)iVar19;
            iVar19 = iVar19 + 1;
            exp(-dVar12);
          }
          increment[IVar36] = lVar6 * 2;
          IVar36 = IVar36 + 1;
        } while (IVar36 != ndim);
        if (0 < sVar2) {
          memset(GA_Update_Flags[GAme],0,ndim << 3);
        }
      }
      lVar35 = 1;
      free(map);
      free(proclist);
    }
  }
  return lVar35;
}

Assistant:

logical pnga_update55_ghosts(Integer g_a)
{
  Integer idx, i, np, handle=GA_OFFSET + g_a, proc_rem;
  Integer size, ndim, nwidth, increment[MAXDIM];
  Integer width[MAXDIM];
  Integer dims[MAXDIM];
  Integer lo_loc[MAXDIM], hi_loc[MAXDIM];
  Integer plo_loc[MAXDIM]/*, phi_loc[MAXDIM]*/;
  Integer tlo_rem[MAXDIM], thi_rem[MAXDIM];
  Integer slo_rem[MAXDIM], shi_rem[MAXDIM];
  Integer plo_rem[MAXDIM], phi_rem[MAXDIM];
  Integer ld_loc[MAXDIM], ld_rem[MAXDIM];
  int stride_loc[MAXDIM], stride_rem[MAXDIM],count[MAXDIM];
  int msgcnt;
  char *ptr_loc, *ptr_rem;
  Integer me = pnga_nodeid();
  Integer p_handle;
  Integer *_ga_map = NULL;
  Integer *_ga_proclist = NULL;

  /* This routine makes use of the shift algorithm to update data in the
   * ghost cells bounding the local block of visible data. The shift
   * algorithm starts by updating the blocks of data along the first
   * dimension by grabbing a block of data that is width[0] deep but
   * otherwise matches the  dimensions of the data residing on the
   * calling processor. The update of the second dimension, however,
   * grabs a block that is width[1] deep in the second dimension but is
   * ldim0 + 2*width[0] in the first dimensions where ldim0 is the
   * size of the visible data along the first dimension. The remaining
   * dimensions are left the same. For the next update, the width of the
   * second dimension is also increased by 2*width[1] and so on. This
   * algorith makes use of the fact that data for the dimensions that
   * have already been updated is available on each processor and can be
   * used in the updates of subsequent dimensions. The total number of
   * separate updates is 2*ndim, an update in the negative and positive
   * directions for each dimension.
   *
   * This operation is implemented using put calls to place the
   * appropriate data on remote processors. To signal the remote
   * processor that it has received the data, a second put call
   * consisting of a single integer is sent after the first put call and
   * used to update a signal buffer on the remote processor. Each
   * processor can determine how much data it has received by checking
   * its signal buffer. 
   *
   * To perform the update, this routine makes use of several copies of
   * indices marking the upper and lower limits of data. Indices
   * beginning with the character "p" are relative indices marking the
   * location of the data set relative to the origin the local patch of
   * the global array, all other indices are in absolute coordinates and
   * mark locations in the total global array. The indices used by this
   * routine are described below.
   *
   *       lo_loc[], hi_loc[]: The lower and upper indices of the visible
   *       block of data held by the calling processor.
   *
   *       lo_rem[], hi_rem[]: The lower and upper indices of the block
   *       of data on a remote processor or processors that is needed to
   *       fill in the calling processors ghost cells. These indices are
   *       NOT corrected for wrap-around (periodic) boundary conditions
   *       so they can be negative or greater than the array dimension
   *       values held in dims[].
   *
   *       slo_rem[], shi_rem[]: Similar to lo_rem[] and hi_rem[], except
   *       that these indices have been corrected for wrap-around
   *       boundary conditions. 
   *
   *       thi_rem[], thi_rem[]: The lower and upper indices of the visible
   *       data on a remote processor.
   *
   *       plo_loc[], phi_loc[]: The indices of the local data patch that
   *       is going to be updated.
   *
   *       plo_rem[], phi_rem[]: The indices of the data patch on the
   *       remote processor that will be used to update the data on the
   *       calling processor. Note that the dimensions of the patches
   *       represented by plo_loc[], plo_rem[] and plo_loc[], phi_loc[]
   *       must be the same.
   */

  /* if global array has no ghost cells, just return */
  if (!pnga_has_ghosts(g_a)) return TRUE;

  size = GA[handle].elemsize;
  ndim = GA[handle].ndim;
  p_handle = GA[handle].p_handle;

  /* initialize range increments and get array dimensions */
  for (idx=0; idx < ndim; idx++) {
    increment[idx] = 0;
    width[idx] = (Integer)GA[handle].width[idx];
    dims[idx] = (Integer)GA[handle].dims[idx];
    if (lo_loc[idx] == 0 && hi_loc[idx] == -1) return FALSE;
  }

  /* Check to make sure that global array is well-behaved (all processors
     have data and the width of the data in each dimension is greater
     than the corresponding value in width[]. */
  if (!gai_check_ghost_distr(g_a)) return FALSE;

  _ga_map = malloc((GAnproc*2*MAXDIM+1)*sizeof(Integer));
  if(!_ga_map) pnga_error("pnga_update55_ghosts:malloc failed (_ga_map)",0);
  _ga_proclist = malloc(GAnproc*sizeof(Integer));
  if(!_ga_proclist) pnga_error("pnga_update55_ghosts:malloc failed (_ga_proclist)",0);

  /* Get pointer to local memory */
  ptr_loc = GA[handle].ptr[GAme];
  /* obtain range of data that is held by local processor */
  pnga_distribution(g_a,me,lo_loc,hi_loc);

  /* loop over dimensions for sequential update using shift algorithm */
  msgcnt = 0;
  (*GA_Update_Signal) = 1;
  for (idx=0; idx < ndim; idx++) {
    nwidth = width[idx];

    /* Do not bother with update if nwidth is zero */
    if (nwidth != 0) {

      /* Perform update in negative direction. */
      get_remote_block_neg(idx, ndim, lo_loc, hi_loc, slo_rem, shi_rem,
                           dims, width);
      /* locate processor with this data */
      if (!pnga_locate_region(g_a, slo_rem, shi_rem, _ga_map,
          _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
          slo_rem, shi_rem, g_a);

      /* Get actual coordinates of desired location of remote
         data as well as the actual coordinates of the local chunk
         of data that will be sent to remote processor (these
         coordinates take into account the presence of ghost
         cells). Start by finding out what data is actually held by
         remote processor. */
      proc_rem = _ga_proclist[0];
      pnga_distribution(g_a, proc_rem, tlo_rem, thi_rem);
      for (i = 0; i < ndim; i++) {
        if (increment[i] == 0) {
          if (i == idx) {
            plo_rem[i] = thi_rem[i] - tlo_rem[i] + width[i] + 1;
            phi_rem[i] = thi_rem[i] - tlo_rem[i] + 2*width[i];
            plo_loc[i] = width[i];
            /*phi_loc[i] = 2*width[i] - 1;*/
          } else {
            plo_rem[i] = width[i];
            phi_rem[i] = thi_rem[i] - tlo_rem[i] + width[i];
            plo_loc[i] = width[i];
            /*phi_loc[i] = hi_loc[i] - lo_loc[i] + width[i];*/
          }
        } else {
          plo_rem[i] = 0;
          phi_rem[i] = thi_rem[i] - tlo_rem[i] + increment[i];
          plo_loc[i] = 0;
          /*phi_loc[i] = hi_loc[i] - lo_loc[i] + increment[i];*/
        }
      }

      /* Get pointer to local data buffer and remote data
         buffer as well as lists of leading dimenstions */
      gam_LocationWithGhosts(me, handle, plo_loc, &ptr_loc, ld_loc);
      gam_LocationWithGhosts(proc_rem, handle, plo_rem, &ptr_rem, ld_rem);

      /* Evaluate strides on local and remote processors */
      gam_setstride(ndim, size, ld_loc, ld_rem, stride_rem,
          stride_loc);

      /* Compute the number of elements in each dimension and store
         result in count. Scale the first element in count by the
         element size. */
      gam_ComputeCount(ndim, plo_rem, phi_rem, count);
      count[0] *= size;

      /* Put local data on remote processor */
      if (p_handle >= 0) {
        proc_rem = PGRP_LIST[p_handle].inv_map_proc_list[proc_rem];
      }
#if 0
      ARMCI_PutS(ptr_loc, stride_loc, ptr_rem, stride_rem, count, ndim- 1, proc_rem);
      /* Send signal to remote processor that data transfer has been completed. */
      bytes = sizeof(int);
      ARMCI_Put(GA_Update_Signal, GA_Update_Flags[proc_rem]+msgcnt, bytes, proc_rem);
#else
      ARMCI_PutS_flag(ptr_loc, stride_loc, ptr_rem, stride_rem, count,
          (int)(ndim - 1), GA_Update_Flags[proc_rem]+msgcnt,
          *GA_Update_Signal, (int)proc_rem);
#endif
      msgcnt++;

      /* Perform update in positive direction. */
      get_remote_block_pos(idx, ndim, lo_loc, hi_loc, slo_rem, shi_rem,
                           dims, width);
      /* locate processor with this data */
      if (!pnga_locate_region(g_a, slo_rem, shi_rem, _ga_map,
          _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
          slo_rem, shi_rem, g_a);

      /* Get actual coordinates of desired chunk of remote
         data as well as the actual coordinates of the local chunk
         of data that will receive the remote data (these
         coordinates take into account the presence of ghost
         cells). Start by finding out what data is actually held by
         remote processor. */
      proc_rem = _ga_proclist[0];
      pnga_distribution(g_a, proc_rem, tlo_rem, thi_rem);
      for (i = 0; i < ndim; i++) {
        if (increment[i] == 0) {
          if (i == idx) {
            plo_rem[i] = 0;
            phi_rem[i] = width[i] - 1;
            plo_loc[i] = hi_loc[i] - lo_loc[i] + width[i] - 1;
            /*phi_loc[i] = hi_loc[i] - lo_loc[i] + 2*width[i] - 1;*/
          } else {
            plo_rem[i] = width[i];
            phi_rem[i] = thi_rem[i] - tlo_rem[i] + width[i];
            plo_loc[i] = width[i];
            /*phi_loc[i] = hi_loc[i] - lo_loc[i] + width[i];*/
          }
        } else {
          plo_rem[i] = 0;
          phi_rem[i] = thi_rem[i] - tlo_rem[i] + increment[i];
          plo_loc[i] = 0;
          /*phi_loc[i] = hi_loc[i] - lo_loc[i] + increment[i];*/
        }
      }

      /* Get pointer to local data buffer and remote data
         buffer as well as lists of leading dimenstions */
      gam_LocationWithGhosts(GAme, handle, plo_loc, &ptr_loc, ld_loc);
      gam_LocationWithGhosts(proc_rem, handle, plo_rem, &ptr_rem, ld_rem);

      /* Evaluate strides on local and remote processors */
      gam_setstride(ndim, size, ld_loc, ld_rem, stride_rem,
          stride_loc);

      /* Compute the number of elements in each dimension and store
         result in count. Scale the first element in count by the
         element size. */
      gam_ComputeCount(ndim, plo_rem, phi_rem, count);
      count[0] *= size;

      /* Put local data on remote processor */
      if (p_handle >= 0) {
        proc_rem = PGRP_LIST[p_handle].inv_map_proc_list[proc_rem];
      }
#if 0
      ARMCI_PutS(ptr_loc, stride_loc, ptr_rem, stride_rem, count, ndim- 1, proc_rem);
      /* Send signal to remote processor that data transfer has been completed. */
      bytes = sizeof(int);
      ARMCI_Put(GA_Update_Signal, GA_Update_Flags[proc_rem]+msgcnt, bytes, proc_rem);

#else
      ARMCI_PutS_flag(ptr_loc, stride_loc, ptr_rem, stride_rem, count,
          (int)(ndim - 1), GA_Update_Flags[proc_rem]+msgcnt,
          *GA_Update_Signal, (int)proc_rem);
#endif
      msgcnt++;
    }
    /* check to make sure that all messages have been recieved before
       starting update along new dimension */
    waitforflags((GA_Update_Flags[GAme]+msgcnt-2),
        (GA_Update_Flags[GAme]+msgcnt-1));
    /* update increment array */
    increment[idx] = 2*nwidth;
  }

  /* set GA_Update_Flags array to zero for next update operation. */
  for (idx=0; idx < 2*ndim; idx++) {
    GA_Update_Flags[GAme][idx] = 0;
  }

  free(_ga_map);
  free(_ga_proclist);
  return TRUE;
}